

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

bcf1_t * bcf_copy(bcf1_t *dst,bcf1_t *src)

{
  size_t sVar1;
  char *pcVar2;
  bcf1_t *src_local;
  bcf1_t *dst_local;
  
  bcf1_sync(src);
  bcf_clear(dst);
  dst->rid = src->rid;
  dst->pos = src->pos;
  dst->rlen = src->rlen;
  dst->qual = src->qual;
  *(ulong *)&dst->field_0x10 =
       *(ulong *)&dst->field_0x10 & 0xffffffffffff0000 |
       (ulong)((uint)*(undefined8 *)&src->field_0x10 & 0xffff);
  *(ulong *)&dst->field_0x10 =
       *(ulong *)&dst->field_0x10 & 0xffffffff0000ffff |
       (ulong)((uint)((ulong)*(undefined8 *)&src->field_0x10 >> 0x10) & 0xffff) << 0x10;
  *(ulong *)&dst->field_0x10 =
       *(ulong *)&dst->field_0x10 & 0xffffff00ffffffff |
       (ulong)((uint)((ulong)*(undefined8 *)&src->field_0x10 >> 0x20) & 0xff) << 0x20;
  *(ulong *)&dst->field_0x10 =
       *(ulong *)&dst->field_0x10 & 0xffffffffff | *(ulong *)&src->field_0x10 & 0xffffff0000000000;
  sVar1 = (src->shared).l;
  (dst->shared).l = sVar1;
  (dst->shared).m = sVar1;
  pcVar2 = (char *)malloc((dst->shared).l);
  (dst->shared).s = pcVar2;
  memcpy((dst->shared).s,(src->shared).s,(dst->shared).l);
  sVar1 = (src->indiv).l;
  (dst->indiv).l = sVar1;
  (dst->indiv).m = sVar1;
  pcVar2 = (char *)malloc((dst->indiv).l);
  (dst->indiv).s = pcVar2;
  memcpy((dst->indiv).s,(src->indiv).s,(dst->indiv).l);
  return dst;
}

Assistant:

bcf1_t *bcf_copy(bcf1_t *dst, bcf1_t *src)
{
    bcf1_sync(src);

    bcf_clear(dst);
    dst->rid  = src->rid;
    dst->pos  = src->pos;
    dst->rlen = src->rlen;
    dst->qual = src->qual;
    dst->n_info = src->n_info; dst->n_allele = src->n_allele;
    dst->n_fmt = src->n_fmt; dst->n_sample = src->n_sample;

    dst->shared.m = dst->shared.l = src->shared.l;
    dst->shared.s = (char*) malloc(dst->shared.l);
    memcpy(dst->shared.s,src->shared.s,dst->shared.l);

    dst->indiv.m = dst->indiv.l = src->indiv.l;
    dst->indiv.s = (char*) malloc(dst->indiv.l);
    memcpy(dst->indiv.s,src->indiv.s,dst->indiv.l);

    return dst;
}